

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxequilisc.hpp
# Opt level: O0

void soplex::SPxEquiliSC<double>::computeEquiExpVec
               (SVSetBase<double> *vecset,DataArray<int> *coScaleExp,DataArray<int> *scaleExp,
               double epsilon)

{
  bool bVar1;
  int iVar2;
  SVectorBase<double> *this;
  char *pcVar3;
  int *piVar4;
  undefined4 in_EDX;
  int __c;
  undefined4 in_register_00000014;
  SVSetBase<double> *in_RSI;
  double in_XMM0_Qa;
  Real a;
  double a_00;
  double x;
  int j;
  double maxi;
  SVectorBase<double> *vec;
  int i;
  int *in_stack_ffffffffffffff98;
  SVSetBase<double> *in_stack_ffffffffffffffa0;
  uint local_3c;
  double local_38;
  int local_24;
  
  for (local_24 = 0; iVar2 = SVSetBase<double>::num((SVSetBase<double> *)0x2d4913), local_24 < iVar2
      ; local_24 = local_24 + 1) {
    this = SVSetBase<double>::operator[]
                     (in_stack_ffffffffffffffa0,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
    local_38 = 0.0;
    for (local_3c = 0; iVar2 = SVectorBase<double>::size(this), (int)local_3c < iVar2;
        local_3c = local_3c + 1) {
      SVectorBase<double>::value(this,local_3c);
      in_stack_ffffffffffffffa0 = in_RSI;
      pcVar3 = SVectorBase<double>::index(this,(char *)(ulong)local_3c,__c);
      DataArray<int>::operator[]((DataArray<int> *)in_stack_ffffffffffffffa0,(int)pcVar3);
      a = spxLdexp((Real)in_stack_ffffffffffffffa0,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
      a_00 = spxAbs<double>(a);
      bVar1 = GT<double,double,double>(a_00,local_38,in_XMM0_Qa);
      if (!bVar1) {
        a_00 = local_38;
      }
      local_38 = a_00;
    }
    if ((local_38 == 0.0) && (!NAN(local_38))) {
      local_38 = 1.0;
    }
    in_stack_ffffffffffffff98 = (int *)(1.0 / local_38);
    DataArray<int>::operator[]((DataArray<int> *)CONCAT44(in_register_00000014,in_EDX),local_24);
    spxFrexp((Real)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    piVar4 = DataArray<int>::operator[]
                       ((DataArray<int> *)CONCAT44(in_register_00000014,in_EDX),local_24);
    *piVar4 = *piVar4 + -1;
  }
  return;
}

Assistant:

void SPxEquiliSC<R>::computeEquiExpVec(const SVSetBase<R>* vecset, const DataArray<int>& coScaleExp,
                                       DataArray<int>& scaleExp, R epsilon)
{
   assert(vecset != nullptr);

   for(int i = 0; i < vecset->num(); ++i)
   {
      const SVectorBase<R>& vec = (*vecset)[i];

      R maxi = 0.0;

      for(int j = 0; j < vec.size(); ++j)
      {
         const R x = spxAbs(spxLdexp(vec.value(j), coScaleExp[vec.index(j)]));

         if(GT(x, maxi, epsilon))
            maxi = x;
      }

      // empty rows/cols are possible
      if(maxi == 0.0)
         maxi = 1.0;

      assert(maxi > 0.0);

      spxFrexp(Real(1.0 / maxi), &(scaleExp[i]));

      scaleExp[i] -= 1;
   }
}